

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::load_sequence_groups_files(HL1MDLLoader *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  _Setfill<char> _Var3;
  int iVar4;
  _Setw _Var5;
  ulong uVar6;
  uchar **ppuVar7;
  SequenceHeader_HL1 **ppSVar8;
  ostream *poVar9;
  undefined1 local_280 [8];
  string sequence_file_path;
  stringstream local_238 [8];
  stringstream ss;
  ostream local_228 [380];
  int local_ac;
  undefined1 local_a8 [4];
  int i_1;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string file_path_without_extension;
  int i;
  HL1MDLLoader *this_local;
  
  if (1 < this->header_->numseqgroups) {
    this->num_sequence_groups_ = this->header_->numseqgroups;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->num_sequence_groups_;
    uVar6 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    ppuVar7 = (uchar **)operator_new__(uVar6);
    this->anim_buffers_ = ppuVar7;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)this->num_sequence_groups_;
    uVar6 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    ppSVar8 = (SequenceHeader_HL1 **)operator_new__(uVar6);
    this->anim_headers_ = ppSVar8;
    for (file_path_without_extension.field_2._12_4_ = 0;
        (int)file_path_without_extension.field_2._12_4_ < this->num_sequence_groups_;
        file_path_without_extension.field_2._12_4_ = file_path_without_extension.field_2._12_4_ + 1)
    {
      this->anim_buffers_[(int)file_path_without_extension.field_2._12_4_] = (uchar *)0x0;
      this->anim_headers_[(int)file_path_without_extension.field_2._12_4_] =
           (SequenceHeader_HL1 *)0x0;
    }
    DefaultIOSystem::absolutePath(&local_78,this->file_path_);
    iVar4 = (*this->io_->_vptr_IOSystem[3])();
    std::operator+(&local_58,&local_78,(char)iVar4);
    DefaultIOSystem::completeBaseName((string *)local_a8,this->file_path_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   &local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    for (local_ac = 1; local_ac < this->num_sequence_groups_; local_ac = local_ac + 1) {
      std::__cxx11::stringstream::stringstream(local_238);
      std::operator<<(local_228,(string *)local_38);
      _Var5 = std::setw(2);
      poVar9 = std::operator<<(local_228,_Var5);
      _Var3 = std::setfill<char>('0');
      poVar9 = std::operator<<(poVar9,_Var3._M_c);
      std::ostream::operator<<(poVar9,local_ac);
      poVar9 = std::operator<<(local_228,'.');
      BaseImporter::GetExtension((string *)((long)&sequence_file_path.field_2 + 8),this->file_path_)
      ;
      std::operator<<(poVar9,(string *)(sequence_file_path.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(sequence_file_path.field_2._M_local_buf + 8));
      std::__cxx11::stringstream::str();
      load_file_into_buffer<Assimp::MDL::HalfLife::SequenceHeader_HL1>
                (this,(string *)local_280,this->anim_buffers_ + local_ac);
      this->anim_headers_[local_ac] = (SequenceHeader_HL1 *)this->anim_buffers_[local_ac];
      std::__cxx11::string::~string((string *)local_280);
      std::__cxx11::stringstream::~stringstream(local_238);
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void HL1MDLLoader::load_sequence_groups_files() {
    if (header_->numseqgroups <= 1)
        return;

    num_sequence_groups_ = header_->numseqgroups;

    anim_buffers_ = new unsigned char *[num_sequence_groups_];
    anim_headers_ = new SequenceHeader_HL1 *[num_sequence_groups_];
    for (int i = 0; i < num_sequence_groups_; ++i) {
        anim_buffers_[i] = NULL;
        anim_headers_[i] = NULL;
    }

    std::string file_path_without_extension =
            DefaultIOSystem::absolutePath(file_path_) +
            io_->getOsSeparator() +
            DefaultIOSystem::completeBaseName(file_path_);

    for (int i = 1; i < num_sequence_groups_; ++i) {
        std::stringstream ss;
        ss << file_path_without_extension;
        ss << std::setw(2) << std::setfill('0') << i;
        ss << '.' << BaseImporter::GetExtension(file_path_);

        std::string sequence_file_path = ss.str();

        load_file_into_buffer<SequenceHeader_HL1>(sequence_file_path, anim_buffers_[i]);

        anim_headers_[i] = (SequenceHeader_HL1 *)anim_buffers_[i];
    }
}